

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<example::option_t,_std::allocator<example::option_t>_> * __thiscall
example::lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::get
          (lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_> *this)

{
  bool bVar1;
  reference_type pvVar2;
  UI_STRING *uis;
  UI *ui;
  undefined1 local_60 [8];
  vector<example::option_t,_std::allocator<example::option_t>_> tmp;
  undefined1 local_30 [8];
  reader r;
  lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_> *this_local;
  
  r.opts_.super_type.m_storage.dummy_ = (dummy_u)this;
  bVar1 = boost::optional<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::
          operator!(&this->val_);
  if (bVar1) {
    tmp.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(this->buf_).data_;
    detail::reader::reader
              ((reader *)local_30,
               (UI *)tmp.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
               (UI_STRING *)(this->buf_).size_);
    std::vector<example::option_t,_std::allocator<example::option_t>_>::vector
              ((vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
    detail::reader::operator()
              ((reader *)local_30,
               (vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
    ui = (UI *)local_60;
    boost::optional<std::vector<example::option_t,std::allocator<example::option_t>>>::operator=
              ((optional<std::vector<example::option_t,std::allocator<example::option_t>>> *)
               &this->val_,(vector<example::option_t,_std::allocator<example::option_t>_> *)ui);
    std::vector<example::option_t,_std::allocator<example::option_t>_>::~vector
              ((vector<example::option_t,_std::allocator<example::option_t>_> *)local_60);
    detail::reader::~reader((reader *)local_30,ui,uis);
  }
  pvVar2 = boost::optional<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::
           operator*(&this->val_);
  return pvVar2;
}

Assistant:

T& lazy<T>::get() {
        if (!val_) {
            detail::reader r(buf_);
            T tmp;
            r(tmp);
            val_ = tmp;
        }
        return *val_;
    }